

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

int __thiscall soplex::SPxDevexPR<double>::selectLeaveHyper(SPxDevexPR<double> *this,double feastol)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  SPxSolverBase<double> *pSVar5;
  pointer pdVar6;
  pointer pdVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  pSVar5 = (this->super_SPxPricer<double>).thesolver;
  pdVar6 = (pSVar5->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (pSVar5->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (long)(this->bestPrices).super_IdxSet.num;
  if (lVar9 < 1) {
    iVar11 = -1;
    dVar12 = -1.0;
    dVar13 = 0.0;
  }
  else {
    piVar8 = (this->bestPrices).super_IdxSet.idx;
    uVar10 = lVar9 + 1;
    dVar12 = -1.0;
    iVar11 = -1;
    dVar13 = 0.0;
    do {
      iVar3 = piVar8[uVar10 - 2];
      dVar1 = pdVar6[iVar3];
      if (-feastol <= dVar1) {
        iVar4 = (this->bestPrices).super_IdxSet.num;
        (this->bestPrices).super_IdxSet.num = iVar4 + -1;
        piVar8[uVar10 - 2] = piVar8[(long)iVar4 + -1];
        (pSVar5->isInfeasible).data[iVar3] = 0;
        dVar1 = dVar12;
      }
      else {
        dVar2 = pdVar7[iVar3];
        dVar14 = feastol;
        if (feastol <= dVar2) {
          dVar14 = dVar2;
        }
        dVar14 = (dVar1 * dVar1) / dVar14;
        if (dVar13 < dVar14) {
          this->last = dVar2;
          dVar13 = dVar14;
          iVar11 = iVar3;
        }
        dVar1 = dVar14;
        if ((0.0 <= dVar12) && (dVar1 = dVar12, dVar14 < dVar12)) {
          dVar1 = dVar14;
        }
      }
      dVar12 = dVar1;
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  lVar9 = (long)(pSVar5->updateViols).super_IdxSet.num;
  if (0 < lVar9) {
    uVar10 = lVar9 + 1;
    do {
      pSVar5 = (this->super_SPxPricer<double>).thesolver;
      piVar8 = (pSVar5->isInfeasible).data;
      iVar3 = (pSVar5->updateViols).super_IdxSet.idx[uVar10 - 2];
      if (piVar8[iVar3] == 1) {
        dVar1 = pdVar6[iVar3];
        dVar2 = pdVar7[iVar3];
        dVar14 = feastol;
        if (feastol <= dVar2) {
          dVar14 = dVar2;
        }
        dVar14 = (dVar1 * dVar1) / dVar14;
        if (dVar12 < dVar14) {
          if (dVar13 < dVar14) {
            this->last = dVar2;
            dVar13 = dVar14;
            iVar11 = iVar3;
          }
          piVar8[iVar3] = 2;
          DIdxSet::addIdx(&this->bestPrices,iVar3);
        }
      }
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  return iVar11;
}

Assistant:

int SPxDevexPR<R>::selectLeaveHyper(R feastol)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   R leastBest = -1;
   int bstI = -1;
   int idx = -1;

   // find the best price from the short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            bstI = idx;
            last = cpen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = fTest[idx];
         assert(x < -feastol);
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > leastBest)
         {
            if(x > best)
            {
               best = x;
               bstI = idx;
               last = cpen[idx];
            }

            // put index into candidate list
            this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
            bestPrices.addIdx(idx);
         }
      }
   }

   return bstI;
}